

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O0

int conjgrad_min_lin(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
                    double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,
                    double xtol,double *xf)

{
  int iVar1;
  int local_68;
  int i;
  int rcode;
  double xtol_local;
  double ftol_local;
  double gtol_local;
  double eps_local;
  int MAXITER_local;
  double maxstep_local;
  double *dx_local;
  int N_local;
  double *xi_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  for (local_68 = 0; local_68 < N; local_68 = local_68 + 1) {
    xi[local_68] = dx[local_68] * xi[local_68];
    dx[local_68] = 1.0 / dx[local_68];
  }
  iVar1 = cgpr_mt(funcpt,funcgrad,xi,N,dx,maxstep,MAXITER,niter,eps,gtol,ftol,xtol,xf);
  for (local_68 = 0; local_68 < N; local_68 = local_68 + 1) {
    xi[local_68] = dx[local_68] * xi[local_68];
    dx[local_68] = 1.0 / dx[local_68];
  }
  return iVar1;
}

Assistant:

int conjgrad_min_lin(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double ftol,double xtol,double *xf) {
	int rcode,i;
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 * 5.- Only First Strong Wolfe Condition Achieved (Using Conjugate Gradient Method)
	 * 
	 */ 

	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	
	//rcode = cgpc(xi,N,A,b,xf);
	//rcode = cgpr(funcpt,xi,N,dx,xf);// FR
	rcode = cgpr_mt(funcpt,funcgrad,xi,N,dx,maxstep,MAXITER,niter,eps,gtol,ftol,xtol,xf);//PR+

	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	
	
	return rcode;
}